

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O3

void __thiscall
cinatra::coro_http_server::set_static_res_dir<>
          (coro_http_server *this,string_view uri_suffix,string *file_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  size_type sVar7;
  size_type sVar8;
  long lVar9;
  _List *p_Var10;
  path *ppVar11;
  void *pvVar12;
  pointer this_00;
  bool bVar13;
  path router_path;
  string uri;
  recursive_directory_iterator __begin2;
  string relative_path;
  error_code ec;
  path local_248;
  path local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string_type local_1b8;
  path local_198;
  path local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  string local_118;
  recursive_directory_iterator local_f8;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  pointer local_c0;
  path local_b8;
  recursive_directory_iterator local_90;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  error_code local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_128._M_str = uri_suffix._M_str;
  local_128._M_len = uri_suffix._M_len;
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (file_path,"..",0,2);
  bVar13 = true;
  if (sVar7 == 0xffffffffffffffff) {
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_128,"..",0,2);
    bVar13 = sVar8 != 0xffffffffffffffff;
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_b8,file_path,auto_format);
  cVar4 = std::filesystem::__cxx11::path::has_root_path();
  if (cVar4 != '\0') {
    std::filesystem::__cxx11::path::~path(&local_b8);
LAB_001d909f:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"invalid file path: ",0x13);
    cerr_logger_t::operator<<((cerr_logger_t *)&local_b8,file_path);
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)&local_b8);
    exit(1);
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_198,&local_128,auto_format);
  bVar5 = std::filesystem::__cxx11::path::has_root_path();
  std::filesystem::__cxx11::path::~path(&local_198);
  std::filesystem::__cxx11::path::~path(&local_b8);
  if ((bVar13 | bVar5) == 1) goto LAB_001d909f;
  if (local_128._M_len != 0) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_b8,&local_128,auto_format);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,local_b8._M_pathname._M_dataplus._M_p,
               local_b8._M_pathname._M_dataplus._M_p + local_b8._M_pathname._M_string_length);
    set_static_res_dir<>();
  }
  if (file_path->_M_string_length == 0) {
    std::filesystem::current_path_abi_cxx11_();
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,local_248._M_pathname._M_dataplus._M_p,
               local_248._M_pathname._M_dataplus._M_p +
               (long)(_func_int ***)local_248._M_pathname._M_string_length);
    std::filesystem::__cxx11::path::path(&local_220,&local_1b8,auto_format);
    std::filesystem::absolute(&local_198);
    local_170._M_pathname._M_dataplus._M_p = (pointer)&local_170._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_198._M_pathname._M_dataplus._M_p,
               local_198._M_pathname._M_dataplus._M_p + local_198._M_pathname._M_string_length);
  }
  else {
    ppVar11 = &local_220;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (ppVar11,file_path,auto_format);
    if (local_220._M_pathname._M_string_length == 0) {
LAB_001d8927:
      std::filesystem::__cxx11::path::path(&local_198);
    }
    else {
      uVar6 = local_220._32_4_;
      if ((~local_220._M_cmpts & 3) != 0) {
        if (((local_220._32_8_ & 3) == 0) &&
           (local_220._M_pathname._M_dataplus._M_p[local_220._M_pathname._M_string_length - 1] !=
            '/')) {
          if ((local_220._32_8_ & 3) == 0) {
            lVar9 = std::filesystem::__cxx11::path::_List::end();
            ppVar11 = (path *)(lVar9 + -0x30);
            p_Var10 = (_List *)(lVar9 + -0x10);
            if ((local_220._32_8_ & 3) != 0) {
              p_Var10 = &local_220._M_cmpts;
              ppVar11 = &local_220;
            }
            uVar6 = (uint)*(undefined8 *)p_Var10;
          }
          else {
            ppVar11 = &local_220;
          }
          if ((~uVar6 & 3) == 0) goto LAB_001d8915;
        }
        goto LAB_001d8927;
      }
LAB_001d8915:
      std::filesystem::__cxx11::path::path(&local_198,ppVar11);
    }
    paVar1 = &local_248._M_pathname.field_2;
    local_248._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,local_198._M_pathname._M_dataplus._M_p,
               local_198._M_pathname._M_dataplus._M_p + local_198._M_pathname._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (file_path,&local_248._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_248._M_pathname._M_dataplus._M_p,
                      local_248._M_pathname.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_198);
    std::filesystem::__cxx11::path::~path(&local_220);
    if (file_path->_M_string_length != 0) {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_198,file_path,auto_format);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,local_198._M_pathname._M_dataplus._M_p,
                 local_198._M_pathname._M_dataplus._M_p + local_198._M_pathname._M_string_length);
      set_static_res_dir<>();
      goto LAB_001d8ae5;
    }
    std::filesystem::current_path_abi_cxx11_();
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,local_248._M_pathname._M_dataplus._M_p,
               local_248._M_pathname._M_dataplus._M_p +
               (long)(_func_int ***)local_248._M_pathname._M_string_length);
    std::filesystem::__cxx11::path::path(&local_220,&local_1b8,auto_format);
    std::filesystem::absolute(&local_198);
    local_170._M_pathname._M_dataplus._M_p = (pointer)&local_170._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,local_198._M_pathname._M_dataplus._M_p,
               local_198._M_pathname._M_dataplus._M_p + local_198._M_pathname._M_string_length);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->static_dir_,&local_170._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_pathname._M_dataplus._M_p != &local_170._M_pathname.field_2) {
    operator_delete(local_170._M_pathname._M_dataplus._M_p,
                    local_170._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_198);
  std::filesystem::__cxx11::path::~path(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_248);
LAB_001d8ae5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->files_,
                    (this->files_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_60._M_value = 0;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_220,&this->static_dir_,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&local_248,&local_220,none,&local_60);
  std::filesystem::__cxx11::path::~path(&local_220);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_pathname._M_string_length ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_170._M_pathname._M_string_length = 0;
  }
  else {
    local_170._M_pathname._M_string_length = local_248._M_pathname._M_string_length;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) + 1;
    }
  }
  local_170._M_pathname._M_dataplus._M_p = local_248._M_pathname._M_dataplus._M_p;
  local_f8._M_dirs._M_ptr = (element_type *)0x0;
  local_f8._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_f8);
  local_90._M_dirs._M_ptr = (element_type *)local_248._M_pathname._M_dataplus._M_p;
  local_90._M_dirs._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_pathname._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_pathname._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) =
           *(_Atomic_word *)(local_248._M_pathname._M_string_length + 8) + 1;
    }
  }
  local_1f8._M_dataplus._M_p = (pointer)0x0;
  local_1f8._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_90);
  paVar1 = &local_220._M_pathname.field_2;
  while (local_170._M_pathname._M_string_length != local_1f8._M_string_length) {
    ppVar11 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                ((recursive_directory_iterator *)&local_170);
    if (local_60._M_value == 0) {
      cVar4 = *(char *)&ppVar11[1]._M_pathname._M_dataplus._M_p;
      if ((cVar4 == '\x03') || (cVar4 == '\0')) {
        cVar4 = std::filesystem::status(ppVar11);
      }
      if (cVar4 != '\x02') {
        pcVar2 = (ppVar11->_M_pathname)._M_dataplus._M_p;
        local_220._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,pcVar2,pcVar2 + (ppVar11->_M_pathname)._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->files_,&local_220._M_pathname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_pathname._M_dataplus._M_p,
                          local_220._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&local_170);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_1f8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_170);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_248);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_220,&this->static_dir_router_path_,auto_format);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  this_00 = (this->files_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (this->files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_c0) {
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_1d8,this_00,(this->static_dir_)._M_string_length,0xffffffffffffffff);
      std::filesystem::__cxx11::path::path(&local_248,&local_1d8,auto_format);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,local_248._M_pathname._M_dataplus._M_p,
                 local_248._M_pathname._M_dataplus._M_p +
                 (long)(_func_int ***)local_248._M_pathname._M_string_length);
      std::filesystem::__cxx11::path::~path(&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      _Var3._M_p = local_148._M_dataplus._M_p;
      if ((local_148._M_string_length != 0) &&
         (pvVar12 = memchr(local_148._M_dataplus._M_p,0x5c,local_148._M_string_length),
         (long)pvVar12 - (long)_Var3._M_p != -1 && pvVar12 != (void *)0x0)) {
        local_248._M_pathname._M_dataplus._M_p = (pointer)&local_248._M_pathname.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"\\","");
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/","");
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_pathname._M_string_length
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          for (sVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 (&local_148,local_248._M_pathname._M_dataplus._M_p,0,
                                  local_248._M_pathname._M_string_length);
              sVar7 != 0xffffffffffffffff;
              sVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (&local_148,local_248._M_pathname._M_dataplus._M_p,
                                 sVar7 + local_1d8._M_string_length,
                                 local_248._M_pathname._M_string_length)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_148,sVar7,local_248._M_pathname._M_string_length,
                       local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_pathname._M_dataplus._M_p != &local_248._M_pathname.field_2) {
          operator_delete(local_248._M_pathname._M_dataplus._M_p,
                          local_248._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this->static_dir_router_path_)._M_string_length == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_1f8,&local_148);
      }
      else {
        std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
                  (&local_170,(char (*) [2])0x2c3214,auto_format);
        std::filesystem::__cxx11::path::_M_append
                  (&local_170,(this->static_dir_router_path_)._M_string_length,
                   (this->static_dir_router_path_)._M_dataplus._M_p);
        std::filesystem::__cxx11::path::_M_concat
                  (&local_170,local_148._M_string_length,local_148._M_dataplus._M_p);
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_80,local_170._M_pathname._M_dataplus._M_p,
                   local_170._M_pathname._M_dataplus._M_p +
                   (long)(_func_int ***)local_170._M_pathname._M_string_length);
        set_static_res_dir<>();
      }
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,local_1f8._M_dataplus._M_p,
                 local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
      local_e0._M_p = (pointer)&local_d0;
      pcVar2 = (this_00->_M_dataplus)._M_p;
      local_e8 = (undefined1  [8])this;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar2,pcVar2 + this_00->_M_string_length);
      set_http_handler<(cinatra::http_method)1,cinatra::coro_http_server::set_static_res_dir<>(std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string)::_lambda(cinatra::coro_http_request&,cinatra::coro_http_response&)_1_>
                (this,&local_118,(anon_class_40_2_16f3dfdb *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) + 1);
    }
  }
  std::filesystem::__cxx11::path::~path(&local_220);
  return;
}

Assistant:

void set_static_res_dir(std::string_view uri_suffix = "",
                          std::string file_path = "www", Aspects &&...aspects) {
    bool has_double_dot = (file_path.find("..") != std::string::npos) ||
                          (uri_suffix.find("..") != std::string::npos);
    if (std::filesystem::path(file_path).has_root_path() ||
        std::filesystem::path(uri_suffix).has_root_path() || has_double_dot) {
      CINATRA_LOG_ERROR << "invalid file path: " << file_path;
      std::exit(1);
    }

    if (!uri_suffix.empty()) {
      static_dir_router_path_ =
          std::filesystem::path(uri_suffix).make_preferred().string();
    }

    if (!file_path.empty()) {
      file_path = std::filesystem::path(file_path).filename().string();
      if (file_path.empty()) {
        static_dir_ = fs::absolute(fs::current_path().string()).string();
      }
      else {
        static_dir_ =
            std::filesystem::path(file_path).make_preferred().string();
      }
    }
    else {
      static_dir_ = fs::absolute(fs::current_path().string()).string();
    }

    files_.clear();
    std::error_code ec;
    for (const auto &file :
         std::filesystem::recursive_directory_iterator(static_dir_, ec)) {
      if (ec) {
        continue;
      }
      if (!file.is_directory()) {
        files_.push_back(file.path().string());
      }
    }

    std::filesystem::path router_path =
        std::filesystem::path(static_dir_router_path_);

    std::string uri;
    for (auto &file : files_) {
      auto relative_path =
          std::filesystem::path(file.substr(static_dir_.length())).string();
      if (size_t pos = relative_path.find('\\') != std::string::npos) {
        replace_all(relative_path, "\\", "/");
      }

      if (static_dir_router_path_.empty()) {
        uri = relative_path;
      }
      else {
        uri = fs::path("/")
                  .append(static_dir_router_path_)
                  .concat(relative_path)
                  .string();
      }

      set_http_handler<cinatra::GET>(
          uri,
          [this, file_name = file](
              coro_http_request &req,
              coro_http_response &resp) -> async_simple::coro::Lazy<void> {
            std::string_view extension = get_extension(file_name);
            std::string_view mime = get_mime_type(extension);
            auto range_str = req.get_header_value("Range");

            if (auto it = static_file_cache_.find(file_name);
                it != static_file_cache_.end()) {
              auto range_header = build_range_header(
                  mime, file_name, std::to_string(fs::file_size(file_name)));
              resp.set_delay(true);
              std::string &body = it->second;
              std::array<asio::const_buffer, 2> arr{asio::buffer(range_header),
                                                    asio::buffer(body)};
              co_await req.get_conn()->async_write(arr);
              co_return;
            }

            std::string content;
            detail::resize(content, chunked_size_);

            coro_io::coro_file in_file{};
            in_file.open(file_name, std::ios::in);
            if (!in_file.is_open()) {
              resp.set_status_and_content(status_type::not_found,
                                          file_name + "not found");
              co_return;
            }

            size_t file_size = fs::file_size(file_name);

            if (format_type_ == file_resp_format_type::chunked &&
                range_str.empty()) {
              resp.set_format_type(format_type::chunked);
              bool ok;
              if (ok = co_await resp.get_conn()->begin_chunked(); !ok) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                bool r = co_await resp.get_conn()->write_chunked(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  co_await resp.get_conn()->end_chunked();
                  break;
                }
              }
            }
            else {
              auto pos = range_str.find('=');
              if (pos != std::string_view::npos) {
                range_str = range_str.substr(pos + 1);
                bool is_valid = true;
                auto ranges =
                    parse_ranges(range_str, fs::file_size(file_name), is_valid);
                if (!is_valid) {
                  resp.set_status(status_type::range_not_satisfiable);
                  co_return;
                }

                assert(!ranges.empty());

                if (ranges.size() == 1) {
                  // single part
                  auto [start, end] = ranges[0];
                  in_file.seek(start, std::ios::beg);
                  size_t part_size = end + 1 - start;
                  int status = (part_size == file_size) ? 200 : 206;
                  std::string content_range = "Content-Range: bytes ";
                  content_range.append(std::to_string(start))
                      .append("-")
                      .append(std::to_string(end))
                      .append("/")
                      .append(std::to_string(file_size))
                      .append(CRCF);
                  auto range_header = build_range_header(
                      mime, file_name, std::to_string(part_size), status,
                      content_range);
                  resp.set_delay(true);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  co_await send_single_part(in_file, content, req, resp,
                                            part_size);
                }
                else {
                  // multiple ranges
                  resp.set_delay(true);
                  std::string file_size_str = std::to_string(file_size);
                  size_t content_len = 0;
                  std::vector<std::string> multi_heads = build_part_heads(
                      ranges, mime, file_size_str, content_len);
                  auto range_header = build_multiple_range_header(content_len);
                  bool r = co_await req.get_conn()->write_data(range_header);
                  if (!r) {
                    co_return;
                  }

                  for (int i = 0; i < ranges.size(); i++) {
                    std::string &part_header = multi_heads[i];
                    r = co_await req.get_conn()->write_data(part_header);
                    if (!r) {
                      co_return;
                    }

                    auto [start, end] = ranges[i];
                    bool ok = in_file.seek(start, std::ios::beg);
                    if (!ok) {
                      resp.set_status_and_content(status_type::bad_request,
                                                  "invalid range");
                      co_await resp.get_conn()->reply();
                      co_return;
                    }
                    size_t part_size = end + 1 - start;

                    std::string_view more = CRCF;
                    if (i == ranges.size() - 1) {
                      more = MULTIPART_END;
                    }
                    r = co_await send_single_part(in_file, content, req, resp,
                                                  part_size, more);
                    if (!r) {
                      co_return;
                    }
                  }
                }
                co_return;
              }

              auto range_header = build_range_header(mime, file_name,
                                                     std::to_string(file_size));
              resp.set_delay(true);
              bool r = co_await req.get_conn()->write_data(range_header);
              if (!r) {
                co_return;
              }

              while (true) {
                auto [ec, size] =
                    co_await in_file.async_read(content.data(), content.size());
                if (ec) {
                  resp.set_status(status_type::no_content);
                  co_await resp.get_conn()->reply();
                  co_return;
                }

                r = co_await req.get_conn()->write_data(
                    std::string_view(content.data(), size));
                if (!r) {
                  co_return;
                }

                if (in_file.eof()) {
                  break;
                }
              }
            }
          },
          std::forward<Aspects>(aspects)...);
    }
  }